

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_make_filled_dims.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    BOOST_TEST((is_same<
        make_filled_dims_t<0, 1>, dimensions<>
    >::value));

    BOOST_TEST((is_same<
        make_filled_dims_t<1, 1  >, dimensions<1>
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<1, 0  >, dimensions<0>
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<1, dyn>, dimensions<dyn>
    >::value));

    BOOST_TEST((is_same<
        make_filled_dims_t<2, 1  >, dimensions<1,   1  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<2, 0  >, dimensions<0,   0  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<2, dyn>, dimensions<dyn, dyn>
    >::value));

    BOOST_TEST((is_same<
        make_filled_dims_t<3, 1  >, dimensions<1,   1,   1  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<3, 0  >, dimensions<0,   0,   0  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<3, dyn>, dimensions<dyn, dyn, dyn>
    >::value));

    return boost::report_errors();
}